

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::ensure_member_packing_rules_msl
          (CompilerMSL *this,SPIRType *ib_type,uint32_t index)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ID id;
  SPIRType *pSVar8;
  CompilerError *this_00;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  uint32_t dim;
  uint32_t uVar12;
  SPIRType physical_type;
  
  bVar5 = validate_member_packing_rules_msl(this,ib_type,index);
  if (bVar5) {
    return;
  }
  pSVar8 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,
                      (ib_type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].id);
  bVar10 = pSVar8->storage == PhysicalStorageBuffer & pSVar8->pointer;
  if (pSVar8->basetype == Struct && bVar10 == 0) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,
               "Cannot perform any repacking for structs when it is used as a member of another struct."
              );
    goto LAB_002519b9;
  }
  bVar5 = Compiler::is_scalar((Compiler *)this,ib_type);
  if (!bVar5) {
    Compiler::set_extended_member_decoration
              ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
               SPIRVCrossDecorationPhysicalTypePacked,0);
  }
  bVar5 = validate_member_packing_rules_msl(this,ib_type,index);
  if (bVar5) {
    return;
  }
  if (((pSVar8->array).super_VectorView<unsigned_int>.buffer_size != 0) &&
     (bVar5 = Compiler::is_matrix((Compiler *)this,pSVar8), !bVar5)) {
    uVar6 = Compiler::type_struct_member_array_stride((Compiler *)this,ib_type,index);
    sVar4 = (pSVar8->array).super_VectorView<unsigned_int>.buffer_size;
    for (uVar12 = 0; (int)sVar4 - 1U != uVar12; uVar12 = uVar12 + 1) {
      uVar7 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar8,uVar12);
      uVar6 = uVar6 / (uVar7 + (uVar7 == 0));
    }
    uVar11 = 8;
    if (bVar10 == 0) {
      uVar11 = (ulong)(pSVar8->width >> 3);
    }
    uVar3 = uVar6 / uVar11;
    uVar9 = (ulong)uVar6 % uVar11;
    if (8 < (uint)uVar3) {
switchD_00251608_caseD_5:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10,uVar11,uVar9);
      CompilerError::CompilerError
                (this_00,"Cannot represent vectors with more than 4 elements in MSL.");
      goto LAB_002519b9;
    }
    uVar9 = (long)&switchD_00251608::switchdataD_0038d0a8 +
            (long)(int)(&switchD_00251608::switchdataD_0038d0a8)[uVar3];
    switch(uVar3) {
    case 3:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Cannot use ArrayStride of 3 elements in remapping scenarios.");
      goto LAB_002519b9;
    case 5:
    case 6:
    case 7:
      goto switchD_00251608_caseD_5;
    case 8:
      if (pSVar8->width != 0x10) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Unexpected type in std140 wide array resolve.");
        goto LAB_002519b9;
      }
      add_spv_func_and_recompile(this,SPVFuncImplPaddedStd140);
    default:
      SPIRType::SPIRType(&physical_type,pSVar8);
      physical_type.parent_type.id = 0;
      if (bVar10 != 0) {
        physical_type.basetype = UInt64;
        physical_type.width = 0x40;
        physical_type.pointer = false;
        physical_type.forward_pointer = false;
        physical_type.pointer_depth = 0;
      }
      physical_type.vecsize = (uint)uVar3;
      id.id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                ((Compiler *)this,id.id,&physical_type);
      Compiler::set_extended_member_decoration
                ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
                 SPIRVCrossDecorationPhysicalTypeID,id.id);
      Compiler::set_decoration((Compiler *)this,id,ArrayStride,uVar6);
      Compiler::unset_extended_member_decoration
                ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
                 SPIRVCrossDecorationPhysicalTypePacked);
    }
    goto LAB_002516a5;
  }
  bVar5 = Compiler::is_matrix((Compiler *)this,pSVar8);
  if (!bVar5) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Found a buffer packing case which we cannot represent in MSL.");
    goto LAB_002519b9;
  }
  uVar6 = Compiler::type_struct_member_matrix_stride((Compiler *)this,ib_type,index);
  uVar11 = (ulong)uVar6 / (ulong)(pSVar8->width >> 3);
  uVar6 = (uint32_t)uVar11;
  switch(uVar11) {
  case 0:
  case 1:
  case 2:
  case 4:
    break;
  case 3:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Cannot use ArrayStride of 3 elements in remapping scenarios.");
    goto LAB_002519b9;
  default:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Cannot represent vectors with more than 4 elements in MSL.");
    goto LAB_002519b9;
  case 8:
    if (pSVar8->basetype != Half) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Unexpected type in std140 wide matrix stride resolve.");
      goto LAB_002519b9;
    }
    add_spv_func_and_recompile(this,SPVFuncImplPaddedStd140);
  }
  bVar5 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,index,
                     DecorationRowMajor);
  SPIRType::SPIRType(&physical_type,pSVar8);
  physical_type.parent_type.id = 0;
  uVar12 = uVar6;
  if (bVar5) {
    uVar12 = physical_type.vecsize;
    physical_type.columns = uVar6;
  }
  physical_type.vecsize = uVar12;
  uVar6 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>((Compiler *)this,uVar6,&physical_type)
  ;
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
             SPIRVCrossDecorationPhysicalTypeID,uVar6);
  Compiler::unset_extended_member_decoration
            ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
             SPIRVCrossDecorationPhysicalTypePacked);
LAB_002516a5:
  SPIRType::~SPIRType(&physical_type);
  bVar5 = validate_member_packing_rules_msl(this,ib_type,index);
  if (bVar5) {
    return;
  }
  uVar6 = Compiler::get_extended_member_decoration
                    ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationPhysicalTypeID);
  pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
  bVar5 = Compiler::is_array((Compiler *)this,pSVar8);
  if (bVar5) {
    puVar2 = (pSVar8->array).super_VectorView<unsigned_int>.ptr;
    sVar4 = (pSVar8->array).super_VectorView<unsigned_int>.buffer_size;
    uVar1 = puVar2[sVar4 - 1];
    if (uVar1 < 2) {
      Compiler::unset_extended_member_decoration
                ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
                 SPIRVCrossDecorationPhysicalTypeID);
      Compiler::set_extended_member_decoration
                ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
                 SPIRVCrossDecorationPhysicalTypePacked,0);
    }
    else {
      if ((pSVar8->array_size_literal).super_VectorView<bool>.ptr
          [(pSVar8->array_size_literal).super_VectorView<bool>.buffer_size - 1] == false) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,"Cannot apply scalar layout workaround with spec constant array size.");
        goto LAB_002519b9;
      }
      puVar2[sVar4 - 1] = uVar1 - 1;
    }
  }
  else {
    bVar5 = Compiler::is_matrix((Compiler *)this,pSVar8);
    if (bVar5) {
      bVar5 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,index,
                         DecorationRowMajor);
      if (bVar5) {
        uVar1 = pSVar8->vecsize;
        if (uVar1 < 3) {
          if (uVar1 == 2) {
            pSVar8->vecsize = pSVar8->columns;
            pSVar8->columns = 1;
            if ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size != 0) {
              __assert_fail("type.array.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                            ,0x139e,
                            "void spirv_cross::CompilerMSL::ensure_member_packing_rules_msl(SPIRType &, uint32_t)"
                           );
            }
LAB_0025185a:
            *(undefined4 *)&(pSVar8->super_IVariant).field_0xc = 0x1c;
            physical_type.super_IVariant._vptr_IVariant._0_4_ = 1;
            SmallVector<unsigned_int,_8UL>::push_back(&pSVar8->array,(uint *)&physical_type);
            physical_type.super_IVariant._vptr_IVariant._0_1_ = 1;
            SmallVector<bool,_8UL>::push_back(&pSVar8->array_size_literal,(bool *)&physical_type);
          }
        }
        else {
          pSVar8->vecsize = uVar1 - 1;
        }
      }
      else {
        uVar1 = pSVar8->columns;
        if (uVar1 < 3) {
          if (uVar1 == 2) {
            pSVar8->columns = 1;
            if ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size != 0) {
              __assert_fail("type.array.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                            ,0x138d,
                            "void spirv_cross::CompilerMSL::ensure_member_packing_rules_msl(SPIRType &, uint32_t)"
                           );
            }
            goto LAB_0025185a;
          }
        }
        else {
          pSVar8->columns = uVar1 - 1;
        }
      }
    }
  }
  bVar5 = validate_member_packing_rules_msl(this,ib_type,index);
  if (bVar5) {
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError
            (this_00,"Found a buffer packing case which we cannot represent in MSL.");
LAB_002519b9:
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerMSL::ensure_member_packing_rules_msl(SPIRType &ib_type, uint32_t index)
{
	if (validate_member_packing_rules_msl(ib_type, index))
		return;

	// We failed validation.
	// This case will be nightmare-ish to deal with. This could possibly happen if struct alignment does not quite
	// match up with what we want. Scalar block layout comes to mind here where we might have to work around the rule
	// that struct alignment == max alignment of all members and struct size depends on this alignment.
	// Can't repack structs, but can repack pointers to structs.
	auto &mbr_type = get<SPIRType>(ib_type.member_types[index]);
	bool is_buff_ptr = mbr_type.pointer && mbr_type.storage == StorageClassPhysicalStorageBuffer;
	if (mbr_type.basetype == SPIRType::Struct && !is_buff_ptr)
		SPIRV_CROSS_THROW("Cannot perform any repacking for structs when it is used as a member of another struct.");

	// Perform remapping here.
	// There is nothing to be gained by using packed scalars, so don't attempt it.
	if (!is_scalar(ib_type))
		set_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypePacked);

	// Try validating again, now with packed.
	if (validate_member_packing_rules_msl(ib_type, index))
		return;

	// We're in deep trouble, and we need to create a new PhysicalType which matches up with what we expect.
	// A lot of work goes here ...
	// We will need remapping on Load and Store to translate the types between Logical and Physical.

	// First, we check if we have small vector std140 array.
	// We detect this if we have an array of vectors, and array stride is greater than number of elements.
	if (!mbr_type.array.empty() && !is_matrix(mbr_type))
	{
		uint32_t array_stride = type_struct_member_array_stride(ib_type, index);

		// Hack off array-of-arrays until we find the array stride per element we must have to make it work.
		uint32_t dimensions = uint32_t(mbr_type.array.size() - 1);
		for (uint32_t dim = 0; dim < dimensions; dim++)
			array_stride /= max<uint32_t>(to_array_size_literal(mbr_type, dim), 1u);

		// Pointers are 8 bytes
		uint32_t mbr_width_in_bytes = is_buff_ptr ? 8 : (mbr_type.width / 8);
		uint32_t elems_per_stride = array_stride / mbr_width_in_bytes;

		if (elems_per_stride == 3)
			SPIRV_CROSS_THROW("Cannot use ArrayStride of 3 elements in remapping scenarios.");
		else if (elems_per_stride > 4 && elems_per_stride != 8)
			SPIRV_CROSS_THROW("Cannot represent vectors with more than 4 elements in MSL.");

		if (elems_per_stride == 8)
		{
			if (mbr_type.width == 16)
				add_spv_func_and_recompile(SPVFuncImplPaddedStd140);
			else
				SPIRV_CROSS_THROW("Unexpected type in std140 wide array resolve.");
		}

		auto physical_type = mbr_type;
		physical_type.vecsize = elems_per_stride;
		physical_type.parent_type = 0;

		// If this is a physical buffer pointer, replace type with a ulongn vector.
		if (is_buff_ptr)
		{
			physical_type.width = 64;
			physical_type.basetype = to_unsigned_basetype(physical_type.width);
			physical_type.pointer = false;
			physical_type.pointer_depth = false;
			physical_type.forward_pointer = false;
		}

		uint32_t type_id = ir.increase_bound_by(1);
		set<SPIRType>(type_id, physical_type);
		set_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypeID, type_id);
		set_decoration(type_id, DecorationArrayStride, array_stride);

		// Remove packed_ for vectors of size 1, 2 and 4.
		unset_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypePacked);
	}
	else if (is_matrix(mbr_type))
	{
		// MatrixStride might be std140-esque.
		uint32_t matrix_stride = type_struct_member_matrix_stride(ib_type, index);

		uint32_t elems_per_stride = matrix_stride / (mbr_type.width / 8);

		if (elems_per_stride == 3)
			SPIRV_CROSS_THROW("Cannot use ArrayStride of 3 elements in remapping scenarios.");
		else if (elems_per_stride > 4 && elems_per_stride != 8)
			SPIRV_CROSS_THROW("Cannot represent vectors with more than 4 elements in MSL.");

		if (elems_per_stride == 8)
		{
			if (mbr_type.basetype != SPIRType::Half)
				SPIRV_CROSS_THROW("Unexpected type in std140 wide matrix stride resolve.");
			add_spv_func_and_recompile(SPVFuncImplPaddedStd140);
		}

		bool row_major = has_member_decoration(ib_type.self, index, DecorationRowMajor);
		auto physical_type = mbr_type;
		physical_type.parent_type = 0;

		if (row_major)
			physical_type.columns = elems_per_stride;
		else
			physical_type.vecsize = elems_per_stride;
		uint32_t type_id = ir.increase_bound_by(1);
		set<SPIRType>(type_id, physical_type);
		set_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypeID, type_id);

		// Remove packed_ for vectors of size 1, 2 and 4.
		unset_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypePacked);
	}
	else
		SPIRV_CROSS_THROW("Found a buffer packing case which we cannot represent in MSL.");

	// Try validating again, now with physical type remapping.
	if (validate_member_packing_rules_msl(ib_type, index))
		return;

	// We might have a particular odd scalar layout case where the last element of an array
	// does not take up as much space as the ArrayStride or MatrixStride. This can happen with DX cbuffers.
	// The "proper" workaround for this is extremely painful and essentially impossible in the edge case of float3[],
	// so we hack around it by declaring the offending array or matrix with one less array size/col/row,
	// and rely on padding to get the correct value. We will technically access arrays out of bounds into the padding region,
	// but it should spill over gracefully without too much trouble. We rely on behavior like this for unsized arrays anyways.

	// E.g. we might observe a physical layout of:
	// { float2 a[2]; float b; } in cbuffer layout where ArrayStride of a is 16, but offset of b is 24, packed right after a[1] ...
	uint32_t type_id = get_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &type = get<SPIRType>(type_id);

	// Modify the physical type in-place. This is safe since each physical type workaround is a copy.
	if (is_array(type))
	{
		if (type.array.back() > 1)
		{
			if (!type.array_size_literal.back())
				SPIRV_CROSS_THROW("Cannot apply scalar layout workaround with spec constant array size.");
			type.array.back() -= 1;
		}
		else
		{
			// We have an array of size 1, so we cannot decrement that. Our only option now is to
			// force a packed layout instead, and drop the physical type remap since ArrayStride is meaningless now.
			unset_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypeID);
			set_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypePacked);
		}
	}
	else if (is_matrix(type))
	{
		bool row_major = has_member_decoration(ib_type.self, index, DecorationRowMajor);
		if (!row_major)
		{
			// Slice off one column. If we only have 2 columns, this might turn the matrix into a vector with one array element instead.
			if (type.columns > 2)
			{
				type.columns--;
			}
			else if (type.columns == 2)
			{
				type.columns = 1;
				assert(type.array.empty());
				type.op = OpTypeArray;
				type.array.push_back(1);
				type.array_size_literal.push_back(true);
			}
		}
		else
		{
			// Slice off one row. If we only have 2 rows, this might turn the matrix into a vector with one array element instead.
			if (type.vecsize > 2)
			{
				type.vecsize--;
			}
			else if (type.vecsize == 2)
			{
				type.vecsize = type.columns;
				type.columns = 1;
				assert(type.array.empty());
				type.op = OpTypeArray;
				type.array.push_back(1);
				type.array_size_literal.push_back(true);
			}
		}
	}

	// This better validate now, or we must fail gracefully.
	if (!validate_member_packing_rules_msl(ib_type, index))
		SPIRV_CROSS_THROW("Found a buffer packing case which we cannot represent in MSL.");
}